

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

void Extra_PrintHexadecimalString(char *pString,uint *Sign,int nVars)

{
  char cVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = 1 << ((byte)nVars & 0x1f);
  if (3 < (int)uVar2) {
    uVar4 = (uVar2 >> 2) + 1;
    uVar2 = uVar2 & 0xfffffffc;
    do {
      uVar2 = uVar2 - 4;
      uVar5 = Sign[uVar4 - 2 >> 3] >> ((byte)uVar2 & 0x1c) & 0xf;
      cVar1 = (char)uVar5;
      cVar3 = cVar1 + 'W';
      if (uVar5 < 10) {
        cVar3 = cVar1 + '0';
      }
      *pString = cVar3;
      pString = pString + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  *pString = '\0';
  return;
}

Assistant:

void Extra_PrintHexadecimalString( char * pString, unsigned Sign[], int nVars )
{
    int nDigits, Digit, k;
    // write the number into the file
    nDigits = (1 << nVars) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((Sign[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pString++ = '0' + Digit;
        else
            *pString++ = 'a' + Digit-10;
    }
//    fprintf( pFile, "\n" );
    *pString = 0;
}